

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Stress::LongRunningTests::init(LongRunningTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  TestContext *testCtx;
  char *name;
  Case *pCVar4;
  Case_conflict *pCVar5;
  _Alloc_hider name_00;
  _Alloc_hider desc;
  int iVar6;
  TestCaseGroup *pTVar7;
  LongStressCase *pLVar8;
  undefined8 extraout_RAX;
  undefined8 uVar9;
  undefined8 extraout_RAX_00;
  long lVar10;
  TestContext *pTVar11;
  FeatureProbabilities *pFVar12;
  Probs *pPVar13;
  TestContext *pTVar14;
  bool bVar15;
  ProgramLibrary progLib;
  allocator_type local_211;
  int *local_210;
  TestCaseGroup *local_208;
  TestContext *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_2;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> local_48;
  
  deqp::gls::LongStressTestUtil::ProgramLibrary::ProgramLibrary(&progLib,GLSL_VERSION_300_ES);
  if (init()::memoryLimitCases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar6 != 0) {
      init::memoryLimitCases[0].nameSuffix = "_low_memory";
      init::memoryLimitCases[0].descSuffix = "; use a low buffer memory usage limit";
      init::memoryLimitCases[0].limit = 0x800000;
      init::memoryLimitCases[0].redundantBufferFactor = 2;
      init::memoryLimitCases[1].nameSuffix = "_high_memory";
      init::memoryLimitCases[1].descSuffix = "; use a high buffer memory usage limit";
      init::memoryLimitCases[1].limit = 0x10000000;
      init::memoryLimitCases[1].redundantBufferFactor = 0x40;
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
            ((ProgramContext *)&local_f8,&progLib,4);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts,1,(value_type *)&local_f8,(allocator_type *)&contexts_2);
  deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
  if (init()::cases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::cases);
    if (iVar6 != 0) {
      init::cases[0].name = "always_reupload";
      init::cases[0].desc = "Re-upload buffer data at the beginning of each iteration";
      init::cases[0].redundantBufferFactor = -1;
      init::cases[0].probs.rebuildProgram = 0.0;
      init::cases[0].probs.reuploadTexture = 0.0;
      init::cases[0].probs.reuploadBuffer = 1.0;
      init::cases[0].probs.reuploadWithTexImage = 0.0;
      init::cases[0].probs.reuploadWithBufferData = 0.0;
      init::cases[0].probs.deleteTexture = 0.0;
      init::cases[0].probs.deleteBuffer = 0.0;
      init::cases[0].probs.wastefulTextureMemoryUsage = 0.0;
      init::cases[0].probs.wastefulBufferMemoryUsage = 0.0;
      init::cases[0].probs.clientMemoryAttributeData = 0.0;
      init::cases[0].probs.clientMemoryIndexData = 0.0;
      init::cases[0].probs.randomBufferUploadTarget = 0.0;
      init::cases[0].probs.randomBufferUsage = 0.0;
      init::cases[0].probs.useDrawArrays = 0.0;
      init::cases[0].probs.separateAttributeBuffers = 0.0;
      init::cases[1].name = "always_reupload_bufferdata";
      init::cases[1].desc =
           "Re-upload buffer data at the beginning of each iteration, using glBufferData";
      init::cases[1].redundantBufferFactor = -1;
      init::cases[1].probs.rebuildProgram = 0.0;
      init::cases[1].probs.reuploadTexture = 0.0;
      init::cases[1].probs.reuploadBuffer = 1.0;
      init::cases[1].probs.reuploadWithTexImage = 0.0;
      init::cases[1].probs.reuploadWithBufferData = 1.0;
      init::cases[1].probs.deleteTexture = 0.0;
      init::cases[1].probs.deleteBuffer = 0.0;
      init::cases[1].probs.wastefulTextureMemoryUsage = 0.0;
      init::cases[1].probs.wastefulBufferMemoryUsage = 0.0;
      init::cases[1].probs.useDrawArrays = 0.0;
      init::cases[1].probs.separateAttributeBuffers = 0.0;
      init::cases[1].probs.clientMemoryAttributeData = 0.0;
      init::cases[1].probs.clientMemoryIndexData = 0.0;
      init::cases[1].probs.randomBufferUploadTarget = 0.0;
      init::cases[1].probs.randomBufferUsage = 0.0;
      init::cases[2].name = "always_delete";
      init::cases[2].desc =
           "Delete buffers at the end of each iteration, and re-create at the beginning of the next"
      ;
      init::cases[2].redundantBufferFactor = -1;
      init::cases[2].probs.reuploadWithBufferData = 0.0;
      init::cases[2].probs.deleteTexture = 0.0;
      init::cases[2].probs.rebuildProgram = 0.0;
      init::cases[2].probs.reuploadTexture = 0.0;
      init::cases[2].probs.reuploadBuffer = 0.0;
      init::cases[2].probs.reuploadWithTexImage = 0.0;
      init::cases[2].probs.deleteBuffer = 1.0;
      init::cases[2].probs.wastefulTextureMemoryUsage = 0.0;
      init::cases[2].probs.wastefulBufferMemoryUsage = 0.0;
      init::cases[2].probs.clientMemoryAttributeData = 0.0;
      init::cases[2].probs.clientMemoryIndexData = 0.0;
      init::cases[2].probs.randomBufferUploadTarget = 0.0;
      init::cases[2].probs.randomBufferUsage = 0.0;
      init::cases[2].probs.useDrawArrays = 0.0;
      init::cases[2].probs.separateAttributeBuffers = 0.0;
      init::cases[3].name = "wasteful";
      init::cases[3].desc =
           "Don\'t reuse buffers, and only delete them when given memory limit is reached";
      init::cases[3].redundantBufferFactor = 2;
      init::cases[3].probs.rebuildProgram = 0.0;
      init::cases[3].probs.reuploadTexture = 0.0;
      init::cases[3].probs.reuploadBuffer = 0.0;
      init::cases[3].probs.reuploadWithTexImage = 0.0;
      init::cases[3].probs.reuploadWithBufferData = 0.0;
      init::cases[3].probs.deleteTexture = 0.0;
      init::cases[3].probs.deleteBuffer = 0.0;
      init::cases[3].probs.wastefulTextureMemoryUsage = 0.0;
      init::cases[3].probs.wastefulBufferMemoryUsage = 1.0;
      init::cases[3].probs.useDrawArrays = 0.0;
      init::cases[3].probs.separateAttributeBuffers = 0.0;
      init::cases[3].probs.clientMemoryAttributeData = 0.0;
      init::cases[3].probs.clientMemoryIndexData = 0.0;
      init::cases[3].probs.randomBufferUploadTarget = 0.0;
      init::cases[3].probs.randomBufferUsage = 0.0;
      init::cases[4].name = "separate_attribute_buffers_wasteful";
      init::cases[4].desc = "Give each vertex attribute its own buffer";
      init::cases[4].probs.reuploadWithBufferData = 0.0;
      init::cases[4].probs.deleteTexture = 0.0;
      init::cases[4].probs.deleteBuffer = 0.0;
      init::cases[4].probs.wastefulTextureMemoryUsage = 0.0;
      init::cases[4].probs.rebuildProgram = 0.0;
      init::cases[4].probs.reuploadTexture = 0.0;
      init::cases[4].probs.reuploadBuffer = 0.0;
      init::cases[4].probs.reuploadWithTexImage = 0.0;
      init::cases[4].probs.wastefulBufferMemoryUsage = 1.0;
      init::cases[4].probs.clientMemoryAttributeData = 0.0;
      init::cases[4].probs.clientMemoryIndexData = 0.0;
      init::cases[4].probs.randomBufferUploadTarget = 0.0;
      init::cases[4].probs.randomBufferUsage = 0.0;
      init::cases[4].probs.useDrawArrays = 0.0;
      init::cases[4].probs.separateAttributeBuffers = 1.0;
      init::cases[4].redundantBufferFactor = init::cases[3].redundantBufferFactor;
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"buffer","Buffer stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  lVar10 = 0;
  while (lVar10 != 2) {
    local_210 = &init::memoryLimitCases[lVar10].redundantBufferFactor;
    pCVar4 = init::cases;
    pTVar11 = (TestContext *)0x5;
    local_208 = (TestCaseGroup *)lVar10;
    while( true ) {
      pPVar13 = &pCVar4->probs;
      if (pTVar11 == (TestContext *)0x0) break;
      iVar6 = *(int *)((long)(pPVar13 + -1) + 0x38);
      if (iVar6 < 1) {
        iVar6 = *local_210;
      }
      pLVar8 = (LongStressCase *)operator_new(0x178);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pTVar14 = pCVar2->m_testCtx;
      pRVar3 = pCVar2->m_renderCtx;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      local_200 = (TestContext *)&pTVar11[-1].field_0x5f;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &contexts_2,&local_1f8,*(char **)((long)(pPVar13 + -1) + 0x28));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &contexts_2,init::memoryLimitCases[lVar10].nameSuffix);
      uVar9 = local_f8._M_allocated_capacity;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_1b8,&local_1d8,*(char **)((long)(pPVar13 + -1) + 0x30));
      std::operator+(&local_198,&local_1b8,init::memoryLimitCases[lVar10].descSuffix);
      deqp::gls::LongStressCase::LongStressCase
                (pLVar8,pTVar14,pRVar3,(char *)uVar9,local_198._M_dataplus._M_p,0,
                 init::memoryLimitCases[lVar10].limit,1,50000,&contexts,pPVar13,0x88e8,0x88e8,iVar6,
                 false);
      tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pLVar8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)local_f8._M_local_buf);
      std::__cxx11::string::~string((string *)&contexts_2);
      std::__cxx11::string::~string((string *)&local_1f8);
      pCVar4 = (Case *)(pPVar13 + 1);
      pTVar11 = local_200;
    }
    lVar10 = (long)local_208 + 1;
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            (&contexts);
  if (init()::memoryLimitCases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar6 != 0) {
      init()::memoryLimitCases[0].nameSuffix = "_low_memory";
      init()::memoryLimitCases[0].descSuffix = "; use a low texture memory usage limit";
      init()::memoryLimitCases[0].limit = 0x800000;
      init()::memoryLimitCases[0].numTextures = 6;
      init()::memoryLimitCases[1].nameSuffix = "_high_memory";
      init()::memoryLimitCases[1].descSuffix = "; use a high texture memory usage limit";
      init()::memoryLimitCases[1].limit = 0x10000000;
      init()::memoryLimitCases[1].numTextures = 0xc0;
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  if (init()::cases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::cases);
    if (iVar6 != 0) {
      init()::cases[0].name = "always_reupload";
      init()::cases[0].desc = "Re-upload texture data at the beginning of each iteration";
      init()::cases[0].numTextures = -1;
      init()::cases[0].probs.rebuildProgram = 0.0;
      init()::cases[0].probs.reuploadTexture = 1.0;
      init()::cases[0].probs.reuploadBuffer = 0.0;
      init()::cases[0].probs.reuploadWithTexImage = 0.0;
      init()::cases[0].probs.reuploadWithBufferData = 0.0;
      init()::cases[0].probs.deleteTexture = 0.0;
      init()::cases[0].probs.deleteBuffer = 0.0;
      init()::cases[0].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[0].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[0].probs.clientMemoryAttributeData = 0.0;
      init()::cases[0].probs.clientMemoryIndexData = 0.0;
      init()::cases[0].probs.randomBufferUploadTarget = 0.0;
      init()::cases[0].probs.randomBufferUsage = 0.0;
      init()::cases[0].probs.useDrawArrays = 0.0;
      init()::cases[0].probs.separateAttributeBuffers = 0.0;
      init()::cases[1].name = "always_reupload_teximage";
      init()::cases[1].desc =
           "Re-upload texture data at the beginning of each iteration, using glTexImage*";
      init()::cases[1].numTextures = -1;
      init()::cases[1].probs.rebuildProgram = 0.0;
      init()::cases[1].probs.reuploadTexture = 1.0;
      init()::cases[1].probs.reuploadBuffer = 0.0;
      init()::cases[1].probs.reuploadWithTexImage = 1.0;
      init()::cases[1].probs.reuploadWithBufferData = 0.0;
      init()::cases[1].probs.deleteTexture = 0.0;
      init()::cases[1].probs.deleteBuffer = 0.0;
      init()::cases[1].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[1].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[1].probs.clientMemoryAttributeData = 0.0;
      init()::cases[1].probs.clientMemoryIndexData = 0.0;
      init()::cases[1].probs.randomBufferUploadTarget = 0.0;
      init()::cases[1].probs.randomBufferUsage = 0.0;
      init()::cases[1].probs.useDrawArrays = 0.0;
      init()::cases[1].probs.separateAttributeBuffers = 0.0;
      init()::cases[2].name = "always_delete";
      init()::cases[2].desc =
           "Delete textures at the end of each iteration, and re-create at the beginning of the next"
      ;
      init()::cases[2].numTextures = -1;
      init()::cases[2].probs.rebuildProgram = 0.0;
      init()::cases[2].probs.reuploadTexture = 0.0;
      init()::cases[2].probs.reuploadBuffer = 0.0;
      init()::cases[2].probs.reuploadWithTexImage = 0.0;
      init()::cases[2].probs.reuploadWithBufferData = 0.0;
      init()::cases[2].probs.deleteTexture = 1.0;
      init()::cases[2].probs.separateAttributeBuffers = 0.0;
      init()::cases[2].probs.deleteBuffer = 0.0;
      init()::cases[2].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[2].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[2].probs.clientMemoryAttributeData = 0.0;
      init()::cases[2].probs.clientMemoryIndexData = 0.0;
      init()::cases[2].probs.randomBufferUploadTarget = 0.0;
      init()::cases[2].probs.randomBufferUsage = 0.0;
      init()::cases[2].probs.useDrawArrays = 0.0;
      init()::cases[3].name = "wasteful";
      init()::cases[3].desc =
           "Don\'t reuse textures, and only delete them when given memory limit is reached";
      init()::cases[3].numTextures = 6;
      init()::cases[3].probs.rebuildProgram = 0.0;
      init()::cases[3].probs.reuploadTexture = 0.0;
      init()::cases[3].probs.reuploadBuffer = 0.0;
      init()::cases[3].probs.reuploadWithTexImage = 0.0;
      init()::cases[3].probs.reuploadWithBufferData = 0.0;
      init()::cases[3].probs.deleteTexture = 0.0;
      init()::cases[3].probs.deleteBuffer = 0.0;
      init()::cases[3].probs.wastefulTextureMemoryUsage = 1.0;
      init()::cases[3].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[3].probs.clientMemoryAttributeData = 0.0;
      init()::cases[3].probs.clientMemoryIndexData = 0.0;
      init()::cases[3].probs.randomBufferUploadTarget = 0.0;
      init()::cases[3].probs.randomBufferUsage = 0.0;
      init()::cases[3].probs.useDrawArrays = 0.0;
      init()::cases[3].probs.separateAttributeBuffers = 0.0;
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"texture","Texture stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  pTVar11 = (TestContext *)0x0;
  local_208 = pTVar7;
  while (pTVar11 != (TestContext *)0x2) {
    local_210 = &init()::memoryLimitCases[(long)pTVar11].numTextures;
    pCVar5 = init()::cases;
    lVar10 = 4;
    pTVar14 = pTVar11;
    local_200 = pTVar11;
    while( true ) {
      pPVar13 = &pCVar5->probs;
      bVar15 = lVar10 == 0;
      lVar10 = lVar10 + -1;
      if (bVar15) break;
      iVar6 = *(int *)((long)(pPVar13 + -1) + 0x38);
      if (iVar6 < 1) {
        iVar6 = *local_210;
      }
      deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
                ((ProgramContext *)&local_f8,&progLib,iVar6,0x200,0x200,0.1);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
                (&contexts,1,(value_type *)&local_f8,(allocator_type *)&contexts_2);
      deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
      pLVar8 = (LongStressCase *)operator_new(0x178);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      testCtx = pCVar2->m_testCtx;
      pRVar3 = pCVar2->m_renderCtx;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &contexts_2,&local_1f8,*(char **)((long)(pPVar13 + -1) + 0x28));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &contexts_2,init()::memoryLimitCases[(long)pTVar11].nameSuffix);
      uVar9 = local_f8._M_allocated_capacity;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_1b8,&local_1d8,*(char **)((long)(pPVar13 + -1) + 0x30));
      std::operator+(&local_198,&local_1b8,init()::memoryLimitCases[(long)pTVar11].descSuffix);
      pTVar14 = local_200;
      deqp::gls::LongStressCase::LongStressCase
                (pLVar8,testCtx,pRVar3,(char *)uVar9,local_198._M_dataplus._M_p,
                 init()::memoryLimitCases[(long)pTVar11].limit,0x100000,1,10000,&contexts,pPVar13,
                 0x88e4,0x88e4,1,false);
      tcu::TestNode::addChild((TestNode *)local_208,(TestNode *)pLVar8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)local_f8._M_local_buf);
      std::__cxx11::string::~string((string *)&contexts_2);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
                (&contexts);
      pCVar5 = (Case_conflict *)(pPVar13 + 1);
    }
    pTVar11 = (TestContext *)((long)&pTVar14->m_platform + 1);
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
            ((ProgramContext *)&local_f8,&progLib,1,0x80,0x80,0.5);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts_2,1,(value_type *)&local_f8,(allocator_type *)&local_1f8);
  deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
  if (init()::cases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::cases);
    if (iVar6 != 0) {
      init()::cases[0].name = "client_memory_data";
      init()::cases[0].desc =
           "Use client-memory for index and attribute data, instead of GL buffers";
      init()::cases[0].drawCallsPerIteration = 200;
      init()::cases[0].numTrisPerDrawCall = 500;
      init()::cases[0].probs.rebuildProgram = 0.0;
      init()::cases[0].probs.reuploadTexture = 0.0;
      init()::cases[0].probs.reuploadBuffer = 0.0;
      init()::cases[0].probs.reuploadWithTexImage = 0.0;
      init()::cases[0].probs.reuploadWithBufferData = 0.0;
      init()::cases[0].probs.deleteTexture = 0.0;
      init()::cases[0].probs.deleteBuffer = 0.0;
      init()::cases[0].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[0].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[0].probs.clientMemoryAttributeData = 1.0;
      init()::cases[0].probs.clientMemoryIndexData = 1.0;
      init()::cases[0].probs.randomBufferUploadTarget = 0.0;
      init()::cases[0].probs.randomBufferUsage = 0.0;
      init()::cases[0].probs.useDrawArrays = 0.0;
      init()::cases[0].probs.separateAttributeBuffers = 0.0;
      init()::cases[1].name = "vary_draw_function";
      init()::cases[1].desc =
           "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability"
      ;
      init()::cases[1].drawCallsPerIteration = 200;
      init()::cases[1].numTrisPerDrawCall = 500;
      init()::cases[1].probs.rebuildProgram = 0.0;
      init()::cases[1].probs.reuploadTexture = 0.0;
      init()::cases[1].probs.reuploadBuffer = 0.0;
      init()::cases[1].probs.reuploadWithTexImage = 0.0;
      init()::cases[1].probs.randomBufferUsage = 0.0;
      init()::cases[1].probs.reuploadWithBufferData = 0.0;
      init()::cases[1].probs.deleteTexture = 0.0;
      init()::cases[1].probs.deleteBuffer = 0.0;
      init()::cases[1].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[1].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[1].probs.clientMemoryAttributeData = 0.0;
      init()::cases[1].probs.clientMemoryIndexData = 0.0;
      init()::cases[1].probs.randomBufferUploadTarget = 0.0;
      init()::cases[1].probs.useDrawArrays = 0.5;
      init()::cases[1].probs.separateAttributeBuffers = 0.0;
      init()::cases[2].name = "few_big_calls";
      init()::cases[2].desc =
           "Per iteration, do a few draw calls with a big number of triangles per call";
      init()::cases[2].drawCallsPerIteration = 2;
      init()::cases[2].numTrisPerDrawCall = 50000;
      init()::cases[2].probs.randomBufferUsage = 0.0;
      init()::cases[2].probs.useDrawArrays = 0.0;
      init()::cases[2].probs.separateAttributeBuffers = 0.0;
      init()::cases[2].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[2].probs.clientMemoryAttributeData = 0.0;
      init()::cases[2].probs.clientMemoryIndexData = 0.0;
      init()::cases[2].probs.randomBufferUploadTarget = 0.0;
      init()::cases[2].probs.reuploadWithBufferData = 0.0;
      init()::cases[2].probs.deleteTexture = 0.0;
      init()::cases[2].probs.deleteBuffer = 0.0;
      init()::cases[2].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[2].probs.rebuildProgram = 0.0;
      init()::cases[2].probs.reuploadTexture = 0.0;
      init()::cases[2].probs.reuploadBuffer = 0.0;
      init()::cases[2].probs.reuploadWithTexImage = 0.0;
      init()::cases[3].name = "many_small_calls";
      init()::cases[3].desc =
           "Per iteration, do many draw calls with a small number of triangles per call";
      init()::cases[3].drawCallsPerIteration = 2000;
      init()::cases[3].numTrisPerDrawCall = 0x32;
      init()::cases[3].probs.rebuildProgram = 0.0;
      init()::cases[3].probs.reuploadTexture = 0.0;
      init()::cases[3].probs.reuploadBuffer = 0.0;
      init()::cases[3].probs.reuploadWithTexImage = 0.0;
      init()::cases[3].probs.reuploadWithBufferData = 0.0;
      init()::cases[3].probs.deleteTexture = 0.0;
      init()::cases[3].probs.deleteBuffer = 0.0;
      init()::cases[3].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[3].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[3].probs.clientMemoryAttributeData = 0.0;
      init()::cases[3].probs.clientMemoryIndexData = 0.0;
      init()::cases[3].probs.randomBufferUploadTarget = 0.0;
      init()::cases[3].probs.randomBufferUsage = 0.0;
      init()::cases[3].probs.useDrawArrays = 0.0;
      init()::cases[3].probs.separateAttributeBuffers = 0.0;
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"draw_call","Draw call stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  lVar10 = 4;
  pFVar12 = &init()::cases[0].probs;
  while (bVar15 = lVar10 != 0, lVar10 = lVar10 + -1, bVar15) {
    pLVar8 = (LongStressCase *)operator_new(0x178);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,pCVar2->m_testCtx,pCVar2->m_renderCtx,
               *(char **)&pFVar12[-1].clientMemoryAttributeData,
               *(char **)&pFVar12[-1].randomBufferUploadTarget,0x100000,0x200000,
               (int)pFVar12[-1].useDrawArrays,(int)pFVar12[-1].separateAttributeBuffers,&contexts_2,
               pFVar12,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pLVar8);
    pFVar12 = (FeatureProbabilities *)&pFVar12[1].wastefulTextureMemoryUsage;
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            (&contexts_2);
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
            ((ProgramContext *)&local_f8,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_f8);
  deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
            ((ProgramContext *)&local_f8,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_f8);
  deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
  if (init()::cases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::cases);
    if (iVar6 != 0) {
      init()::cases[0].name = "several_programs";
      init()::cases[0].desc =
           "Use several different programs, choosing between them uniformly on each iteration";
      init()::cases[0].probs.rebuildProgram = 0.0;
      init()::cases[0].probs.reuploadTexture = 0.0;
      init()::cases[0].probs.reuploadBuffer = 0.0;
      init()::cases[0].probs.reuploadWithTexImage = 0.0;
      init()::cases[0].probs.reuploadWithBufferData = 0.0;
      init()::cases[0].probs.deleteTexture = 0.0;
      init()::cases[0].probs.deleteBuffer = 0.0;
      init()::cases[0].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[0].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[0].probs.clientMemoryAttributeData = 0.0;
      init()::cases[0].probs.clientMemoryIndexData = 0.0;
      init()::cases[0].probs.randomBufferUploadTarget = 0.0;
      init()::cases[0].probs.randomBufferUsage = 0.0;
      init()::cases[0].probs.useDrawArrays = 0.0;
      init()::cases[0].probs.separateAttributeBuffers = 0.0;
      init()::cases[1].name = "several_programs_always_rebuild";
      init()::cases[1].desc =
           "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program"
      ;
      init()::cases[1].probs.rebuildProgram = 1.0;
      init()::cases[1].probs.reuploadTexture = 0.0;
      init()::cases[1].probs.reuploadBuffer = 0.0;
      init()::cases[1].probs.reuploadWithTexImage = 0.0;
      init()::cases[1].probs.reuploadWithBufferData = 0.0;
      init()::cases[1].probs.deleteTexture = 0.0;
      init()::cases[1].probs.deleteBuffer = 0.0;
      init()::cases[1].probs.wastefulTextureMemoryUsage = 0.0;
      init()::cases[1].probs.wastefulBufferMemoryUsage = 0.0;
      init()::cases[1].probs.clientMemoryAttributeData = 0.0;
      init()::cases[1].probs.clientMemoryIndexData = 0.0;
      init()::cases[1].probs.randomBufferUploadTarget = 0.0;
      init()::cases[1].probs.randomBufferUsage = 0.0;
      init()::cases[1].probs.useDrawArrays = 0.0;
      init()::cases[1].probs.separateAttributeBuffers = 0.0;
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"program","Shader program stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  lVar10 = 2;
  pFVar12 = &init()::cases[0].probs;
  while (bVar15 = lVar10 != 0, lVar10 = lVar10 + -1, bVar15) {
    pLVar8 = (LongStressCase *)operator_new(0x178);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,pCVar2->m_testCtx,pCVar2->m_renderCtx,
               *(char **)&pFVar12[-1].randomBufferUploadTarget,*(char **)&pFVar12[-1].useDrawArrays,
               0x300000,0x100000,1,10000,&contexts_2,pFVar12,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pLVar8);
    pFVar12 = (FeatureProbabilities *)&pFVar12[1].deleteTexture;
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            (&contexts_2);
  if (init()::memoryLimitCases == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar6 != 0) {
      init()::memoryLimitCases[0].nameSuffix = "_low_memory";
      init()::memoryLimitCases[0].descSuffix = "; use a low memory usage limit";
      init()::memoryLimitCases[0].texLimit = 0x800000;
      init()::memoryLimitCases[0].bufLimit = 0x800000;
      init()::memoryLimitCases[1].nameSuffix = "_high_memory";
      init()::memoryLimitCases[1].descSuffix = "; use a high memory usage limit";
      init()::memoryLimitCases[1].texLimit = 0x8000000;
      init()::memoryLimitCases[1].bufLimit = 0x8000000;
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"mixed","Mixed stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  lVar10 = 0;
  uVar9 = extraout_RAX;
  while( true ) {
    if (lVar10 == 0x30) break;
    pLVar8 = (LongStressCase *)operator_new(0x178);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_200 = pCVar2->m_testCtx;
    local_208 = (TestCaseGroup *)pCVar2->m_renderCtx;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_198,&local_1b8,"buffer_texture_wasteful");
    std::operator+(&local_1f8,&local_198,
                   *(char **)((long)&init()::memoryLimitCases[0].nameSuffix + lVar10));
    name_00._M_p = local_1f8._M_dataplus._M_p;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts_4.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)contexts_4.
                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contexts,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contexts_4,
                   "Use both buffers and textures wastefully");
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contexts,
                   *(char **)((long)&init()::memoryLimitCases[0].descSuffix + lVar10));
    desc._M_p = local_1d8._M_dataplus._M_p;
    iVar6 = *(int *)((long)&init()::memoryLimitCases[0].texLimit + lVar10);
    uVar1 = *(uint *)((long)&init()::memoryLimitCases[0].bufLimit + lVar10);
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
              ((ProgramContext *)&local_f8,&progLib,4,0x200,0x200);
    local_210 = (int *)(ulong)uVar1;
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
              (&local_48,1,(value_type *)&local_f8,&local_211);
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3f000000;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f000000;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3e4ccccd;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,local_200,(RenderContext *)local_208,name_00._M_p,desc._M_p,iVar6,
               (int)local_210,1,10000,&local_48,(FeatureProbabilities *)&contexts_2,0x88e4,0x88e4,1,
               false);
    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pLVar8);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&local_48);
    deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&contexts);
    std::__cxx11::string::~string((string *)&contexts_4);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
              ((ProgramContext *)&local_f8,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_f8);
    deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
              ((ProgramContext *)&local_f8,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_f8);
    deqp::gls::ProgramContext::~ProgramContext((ProgramContext *)&local_f8);
    pLVar8 = (LongStressCase *)operator_new(0x178);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pTVar11 = pCVar2->m_testCtx;
    pRVar3 = pCVar2->m_renderCtx;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_1f8,&local_198,"random");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contexts_2,
                   &local_1f8,*(char **)((long)&init()::memoryLimitCases[0].nameSuffix + lVar10));
    name = (char *)CONCAT44(contexts_2.
                            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            contexts_2.
                            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contexts,
                   "Highly random behavior");
    std::operator+(&local_1b8,&local_1d8,
                   *(char **)((long)&init()::memoryLimitCases[0].descSuffix + lVar10));
    local_f8._M_allocated_capacity = 0x3e99999a3e99999a;
    local_f8._8_8_ = 0x3e99999a3e99999a;
    local_e8 = 0x3e4ccccd3e99999a;
    uStack_e0 = 0x3e99999a3e4ccccd;
    local_c0 = 0x3ecccccd;
    local_d8 = 0x3e4ccccd3e99999a;
    uStack_d0 = 0x3f8000003e4ccccd;
    local_c8 = 0x3ecccccd3f800000;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,pTVar11,pRVar3,name,local_1b8._M_dataplus._M_p,
               *(int *)((long)&init()::memoryLimitCases[0].texLimit + lVar10),
               *(int *)((long)&init()::memoryLimitCases[0].bufLimit + lVar10),1,10000,&contexts_4,
               (FeatureProbabilities *)&local_f8,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pLVar8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&contexts);
    std::__cxx11::string::~string((string *)&contexts_2);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_198);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&contexts_4);
    lVar10 = lVar10 + 0x18;
    uVar9 = extraout_RAX_00;
  }
  return (int)uVar9;
}

Assistant:

void LongRunningTests::init (void)
{
	static const int								Mi			= 1<<20;
	const gls::LongStressTestUtil::ProgramLibrary	progLib		(glu::GLSL_VERSION_300_ES);

	typedef gls::LongStressCase::FeatureProbabilities Probs;

	// Buffer cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			redundantBufferFactor;
			MemCase (const char* n, const char* d, int l, int r) : nameSuffix(n), descSuffix(d), limit(l), redundantBufferFactor(r) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low buffer memory usage limit",	8*Mi,		2),
			MemCase("_high_memory",	"; use a high buffer memory usage limit",	256*Mi,		64)
		};

		const std::vector<gls::ProgramContext> contexts(1, progLib.generateBufferContext(4));

		static const struct Case
		{
			const char* const	name;
			const char*	const	desc;
			const int			redundantBufferFactor; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int bufFact, const Probs& probs_ = Probs()) : name(name_), desc(desc_), redundantBufferFactor(bufFact), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload buffer data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadBuffer(1.0f)),

			Case("always_reupload_bufferdata",
				 "Re-upload buffer data at the beginning of each iteration, using glBufferData",
				 -1,
				 Probs().pReuploadBuffer(1.0f).pReuploadWithBufferData(1.0f)),

			Case("always_delete",
				 "Delete buffers at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteBuffer(1.0f)),

			Case("wasteful",
				 "Don't reuse buffers, and only delete them when given memory limit is reached",
				 2,
				 Probs().pWastefulBufferMemoryUsage(1.0f)),

			Case("separate_attribute_buffers_wasteful",
				 "Give each vertex attribute its own buffer",
				 2,
				 Probs().pSeparateAttribBuffers(1.0f).pWastefulBufferMemoryUsage(1.0f))
		};

		TestCaseGroup* const bufferGroup = new TestCaseGroup(m_context, "buffer", "Buffer stress tests");
		addChild(bufferGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int redundantBufferFactor = cases[caseNdx].redundantBufferFactor > 0 ? cases[caseNdx].redundantBufferFactor : memoryLimitCases[memoryLimitNdx].redundantBufferFactor;

				bufferGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															  (string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															  (string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  0 /* tex memory */, memoryLimitCases[memoryLimitNdx].limit,
															  1 /* draw calls per iteration */, 50000 /* tris per call */,
															  contexts, cases[caseNdx].probs,
															  GL_DYNAMIC_DRAW, GL_DYNAMIC_DRAW,
															  redundantBufferFactor));
			}
		}
	}

	// Texture cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			numTextures;
			MemCase (const char* n, const char* d, int l, int t) : nameSuffix(n), descSuffix(d), limit(l), numTextures(t) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low texture memory usage limit",	8*Mi,		6),
			MemCase("_high_memory",	"; use a high texture memory usage limit",	256*Mi,		192)
		};

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			numTextures; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int numTextures_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), numTextures(numTextures_), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload texture data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadTexture(1.0f)),

			Case("always_reupload_teximage",
				 "Re-upload texture data at the beginning of each iteration, using glTexImage*",
				 -1,
				 Probs().pReuploadTexture(1.0f).pReuploadWithTexImage(1.0f)),

			Case("always_delete",
				 "Delete textures at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteTexture(1.0f)),

			Case("wasteful",
				 "Don't reuse textures, and only delete them when given memory limit is reached",
				 6,
				 Probs().pWastefulTextureMemoryUsage(1.0f))
		};

		TestCaseGroup* const textureGroup = new TestCaseGroup(m_context, "texture", "Texture stress tests");
		addChild(textureGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int								numTextures		= cases[caseNdx].numTextures > 0 ? cases[caseNdx].numTextures : memoryLimitCases[memoryLimitNdx].numTextures;
				const std::vector<gls::ProgramContext>	contexts		(1, progLib.generateTextureContext(numTextures, 512, 512, 0.1f));

				textureGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
																(string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
																(string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
																memoryLimitCases[memoryLimitNdx].limit, 1*Mi /* buf memory */,
																1 /* draw calls per iteration */, 10000 /* tris per call */,
																contexts, cases[caseNdx].probs,
																GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}

	// Draw call cases.

	{
		const std::vector<gls::ProgramContext> contexts(1, progLib.generateTextureContext(1, 128, 128, 0.5f));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			drawCallsPerIteration;
			const int			numTrisPerDrawCall;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const int calls, const int tris, const Probs& probs_ = Probs())
				: name(name_), desc(desc_), drawCallsPerIteration(calls), numTrisPerDrawCall(tris), probs(probs_) {}
		} cases[] =
		{
			Case("client_memory_data",
				 "Use client-memory for index and attribute data, instead of GL buffers",
				 200, 500,
				 Probs().pClientMemoryAttributeData(1.0f).pClientMemoryIndexData(1.0f)),

			Case("vary_draw_function",
				 "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability",
				 200, 500,
				 Probs().pUseDrawArrays(0.5f)),

			Case("few_big_calls",
				 "Per iteration, do a few draw calls with a big number of triangles per call",
				 2, 50000),

			Case("many_small_calls",
				 "Per iteration, do many draw calls with a small number of triangles per call",
				 2000, 50)
		};

		TestCaseGroup* const drawCallGroup = new TestCaseGroup(m_context, "draw_call", "Draw call stress tests");
		addChild(drawCallGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			drawCallGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															cases[caseNdx].name, cases[caseNdx].desc,
															1*Mi /* tex memory */, 2*Mi /* buf memory */,
															cases[caseNdx].drawCallsPerIteration, cases[caseNdx].numTrisPerDrawCall,
															contexts, cases[caseNdx].probs,
															GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Shader cases.

	{
		std::vector<gls::ProgramContext> contexts;
		contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
		contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), probs(probs_) {}
		} cases[] =
		{
			Case("several_programs",
				 "Use several different programs, choosing between them uniformly on each iteration"),

			Case("several_programs_always_rebuild",
				 "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program",
				 Probs().pRebuildProgram(1.0f))
		};

		TestCaseGroup* const shaderGroup = new TestCaseGroup(m_context, "program", "Shader program stress tests");
		addChild(shaderGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			shaderGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														  cases[caseNdx].name, cases[caseNdx].desc,
														  3*Mi /* tex memory */, 1*Mi /* buf memory */,
														  1 /* draw calls per iteration */, 10000 /* tris per call */,
														  contexts, cases[caseNdx].probs,
														  GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Mixed cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			texLimit;
			const int			bufLimit;
			MemCase (const char* n, const char* d, int t, int b) : nameSuffix(n), descSuffix(d), texLimit(t), bufLimit(b) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low memory usage limit",	8*Mi,	8*Mi),
			MemCase("_high_memory",	"; use a high memory usage limit",	128*Mi,	128*Mi)
		};

		TestCaseGroup* const mixedGroup = new TestCaseGroup(m_context, "mixed", "Mixed stress tests");
		addChild(mixedGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														 (string() + "buffer_texture_wasteful"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
														 (string() + "Use both buffers and textures wastefully"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
														 memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
														 1 /* draw calls per iteration */, 10000 /* tris per call */,
														 std::vector<gls::ProgramContext>(1, progLib.generateBufferAndTextureContext(4, 512, 512)),
														 Probs()
														 .pReuploadTexture				(0.3f)
														 .pReuploadWithTexImage			(0.5f)
														 .pReuploadBuffer				(0.3f)
														 .pReuploadWithBufferData		(0.5f)
														 .pDeleteTexture				(0.2f)
														 .pDeleteBuffer					(0.2f)
														 .pWastefulTextureMemoryUsage	(0.5f)
														 .pWastefulBufferMemoryUsage	(0.5f)
														 .pRandomBufferUploadTarget		(1.0f)
														 .pRandomBufferUsage			(1.0f),
														 GL_STATIC_DRAW, GL_STATIC_DRAW));

			{
				std::vector<gls::ProgramContext> contexts;
				contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
				contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));
				mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															 (string() + "random"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															 (string() + "Highly random behavior"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
															 1 /* draw calls per iteration */, 10000 /* tris per call */,
															 contexts,
															 Probs()
															 .pRebuildProgram				(0.3f)
															 .pReuploadTexture				(0.3f)
															 .pReuploadWithTexImage			(0.3f)
															 .pReuploadBuffer				(0.3f)
															 .pReuploadWithBufferData		(0.3f)
															 .pDeleteTexture				(0.2f)
															 .pDeleteBuffer					(0.2f)
															 .pWastefulTextureMemoryUsage	(0.3f)
															 .pWastefulBufferMemoryUsage	(0.3f)
															 .pClientMemoryAttributeData	(0.2f)
															 .pClientMemoryIndexData		(0.2f)
															 .pSeparateAttribBuffers		(0.4f)
															 .pUseDrawArrays				(0.4f)
															 .pRandomBufferUploadTarget		(1.0f)
															 .pRandomBufferUsage			(1.0f),
															 GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}
}